

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
qpdf::Array::getAsVector
          (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__return_storage_ptr__,
          Array *this)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  int iVar2;
  QPDF_Array *pQVar3;
  _Base_ptr p_Var4;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *v;
  
  pQVar3 = array(this);
  if ((pQVar3->sp)._M_t.
      super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
      super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
      super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl == (Sparse *)0x0) {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              (__return_storage_ptr__,&pQVar3->elements);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar2 = size(this);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::reserve
              (__return_storage_ptr__,(long)iVar2);
    _Var1._M_head_impl =
         (pQVar3->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    for (p_Var4 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->elements + 0x18);
        p_Var4 != (_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->elements + 8U);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::resize
                (__return_storage_ptr__,(long)(int)p_Var4[1]._M_color,&null_oh);
      std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
      emplace_back<QPDFObjectHandle_const&>
                ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)__return_storage_ptr__
                 ,(QPDFObjectHandle *)&p_Var4[1]._M_parent);
    }
    iVar2 = size(this);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::resize
              (__return_storage_ptr__,(long)iVar2,&null_oh);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFObjectHandle>
Array::getAsVector() const
{
    auto a = array();
    if (a->sp) {
        std::vector<QPDFObjectHandle> v;
        v.reserve(size_t(size()));
        for (auto const& item: a->sp->elements) {
            v.resize(size_t(item.first), null_oh);
            v.emplace_back(item.second);
        }
        v.resize(size_t(size()), null_oh);
        return v;
    } else {
        return a->elements;
    }
}